

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void av1_iadst8_sse2(__m128i *input,__m128i *output)

{
  longlong lVar1;
  longlong lVar2;
  __m128i _in1_3;
  __m128i _in1_2;
  undefined1 auVar3 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i _in0_4;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  __m128i _in0;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i _in0_2;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i alVar36;
  __m128i _in0_1;
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128i alVar47;
  __m128i _in0_3;
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  __m128i _in1_1;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  __m128i alVar68;
  __m128i _in1;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  __m128i alVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  __m128i _in0_5;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  __m128i _in1_6;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  __m128i _in1_5;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar57 [16];
  undefined1 auVar63 [16];
  undefined1 auVar58 [16];
  undefined1 auVar64 [16];
  undefined1 auVar59 [16];
  undefined1 auVar65 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  
  alVar47 = input[7];
  alVar36 = input[5];
  alVar68 = input[1];
  alVar76 = input[3];
  lVar1 = input[6][0];
  lVar2 = input[6][1];
  auVar40._0_12_ = alVar47._0_12_;
  auVar40._12_2_ = alVar47[0]._6_2_;
  auVar40._14_2_ = *(undefined2 *)((long)*input + 6);
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._0_10_ = alVar47._0_10_;
  auVar39._10_2_ = *(undefined2 *)((long)*input + 4);
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_8_ = alVar47[0];
  auVar38._8_2_ = alVar47[0]._4_2_;
  auVar37._8_8_ = auVar38._8_8_;
  auVar37._6_2_ = *(undefined2 *)((long)*input + 2);
  auVar37._4_2_ = alVar47[0]._2_2_;
  auVar37._0_2_ = (undefined2)alVar47[0];
  auVar37._2_2_ = (short)(*input)[0];
  auVar29._2_2_ = (short)(*input)[1];
  auVar29._0_2_ = (short)alVar47[1];
  auVar29._4_2_ = alVar47[1]._2_2_;
  auVar29._6_2_ = *(undefined2 *)((long)*input + 10);
  auVar29._8_2_ = alVar47[1]._4_2_;
  auVar29._10_2_ = *(undefined2 *)((long)*input + 0xc);
  auVar29._12_2_ = alVar47[1]._6_2_;
  auVar29._14_2_ = *(undefined2 *)((long)*input + 0xe);
  auVar79._8_4_ = 0x1910fec;
  auVar79._0_8_ = 0x1910fec01910fec;
  auVar79._12_4_ = 0x1910fec;
  auVar22 = pmaddwd(auVar37,auVar79);
  auVar80 = pmaddwd(auVar79,auVar29);
  auVar53._8_4_ = 0xf0140191;
  auVar53._0_8_ = 0xf0140191f0140191;
  auVar53._12_4_ = 0xf0140191;
  auVar41 = pmaddwd(auVar37,auVar53);
  auVar30 = pmaddwd(auVar29,auVar53);
  auVar23._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar81._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar81._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar81._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar81._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar24 = packssdw(auVar23,auVar81);
  auVar42._0_4_ = auVar41._0_4_ + 0x800 >> 0xc;
  auVar42._4_4_ = auVar41._4_4_ + 0x800 >> 0xc;
  auVar42._8_4_ = auVar41._8_4_ + 0x800 >> 0xc;
  auVar42._12_4_ = auVar41._12_4_ + 0x800 >> 0xc;
  auVar31._0_4_ = auVar30._0_4_ + 0x800 >> 0xc;
  auVar31._4_4_ = auVar30._4_4_ + 0x800 >> 0xc;
  auVar31._8_4_ = auVar30._8_4_ + 0x800 >> 0xc;
  auVar31._12_4_ = auVar30._12_4_ + 0x800 >> 0xc;
  auVar43 = packssdw(auVar42,auVar31);
  auVar51._0_12_ = alVar36._0_12_;
  auVar51._12_2_ = alVar36[0]._6_2_;
  auVar51._14_2_ = *(undefined2 *)((long)input[2] + 6);
  auVar50._12_4_ = auVar51._12_4_;
  auVar50._0_10_ = alVar36._0_10_;
  auVar50._10_2_ = *(undefined2 *)((long)input[2] + 4);
  auVar49._10_6_ = auVar50._10_6_;
  auVar49._0_8_ = alVar36[0];
  auVar49._8_2_ = alVar36[0]._4_2_;
  auVar48._8_8_ = auVar49._8_8_;
  auVar48._6_2_ = *(undefined2 *)((long)input[2] + 2);
  auVar48._4_2_ = alVar36[0]._2_2_;
  auVar48._0_2_ = (undefined2)alVar36[0];
  auVar48._2_2_ = (short)input[2][0];
  auVar54._2_2_ = (short)input[2][1];
  auVar54._0_2_ = (short)alVar36[1];
  auVar54._4_2_ = alVar36[1]._2_2_;
  auVar54._6_2_ = *(undefined2 *)((long)input[2] + 10);
  auVar54._8_2_ = alVar36[1]._4_2_;
  auVar54._10_2_ = *(undefined2 *)((long)input[2] + 0xc);
  auVar54._12_2_ = alVar36[1]._6_2_;
  auVar54._14_2_ = *(undefined2 *)((long)input[2] + 0xe);
  auVar85._8_4_ = 0x78b0e1c;
  auVar85._0_8_ = 0x78b0e1c078b0e1c;
  auVar85._12_4_ = 0x78b0e1c;
  auVar22 = pmaddwd(auVar48,auVar85);
  auVar80 = pmaddwd(auVar85,auVar54);
  auVar7._8_4_ = 0xf1e4078b;
  auVar7._0_8_ = 0xf1e4078bf1e4078b;
  auVar7._12_4_ = 0xf1e4078b;
  auVar30 = pmaddwd(auVar48,auVar7);
  auVar41 = pmaddwd(auVar54,auVar7);
  auVar32._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar32._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar32._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar32._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar86._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar86._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar86._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar86._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar33 = packssdw(auVar32,auVar86);
  auVar52._0_4_ = auVar30._0_4_ + 0x800 >> 0xc;
  auVar52._4_4_ = auVar30._4_4_ + 0x800 >> 0xc;
  auVar52._8_4_ = auVar30._8_4_ + 0x800 >> 0xc;
  auVar52._12_4_ = auVar30._12_4_ + 0x800 >> 0xc;
  auVar55._0_4_ = auVar41._0_4_ + 0x800 >> 0xc;
  auVar55._4_4_ = auVar41._4_4_ + 0x800 >> 0xc;
  auVar55._8_4_ = auVar41._8_4_ + 0x800 >> 0xc;
  auVar55._12_4_ = auVar41._12_4_ + 0x800 >> 0xc;
  auVar53 = packssdw(auVar52,auVar55);
  auVar59._0_12_ = alVar76._0_12_;
  auVar59._12_2_ = alVar76[0]._6_2_;
  auVar59._14_2_ = *(undefined2 *)((long)input[4] + 6);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._0_10_ = alVar76._0_10_;
  auVar58._10_2_ = *(undefined2 *)((long)input[4] + 4);
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._0_8_ = alVar76[0];
  auVar57._8_2_ = alVar76[0]._4_2_;
  auVar56._8_8_ = auVar57._8_8_;
  auVar56._6_2_ = *(undefined2 *)((long)input[4] + 2);
  auVar56._4_2_ = alVar76[0]._2_2_;
  auVar56._0_2_ = (undefined2)alVar76[0];
  auVar56._2_2_ = (short)input[4][0];
  auVar11._2_2_ = (short)input[4][1];
  auVar11._0_2_ = (short)alVar76[1];
  auVar11._4_2_ = alVar76[1]._2_2_;
  auVar11._6_2_ = *(undefined2 *)((long)input[4] + 10);
  auVar11._8_2_ = alVar76[1]._4_2_;
  auVar11._10_2_ = *(undefined2 *)((long)input[4] + 0xc);
  auVar11._12_2_ = alVar76[1]._6_2_;
  auVar11._14_2_ = *(undefined2 *)((long)input[4] + 0xe);
  auVar8._8_4_ = 0xc5e0a26;
  auVar8._0_8_ = 0xc5e0a260c5e0a26;
  auVar8._12_4_ = 0xc5e0a26;
  auVar80 = pmaddwd(auVar56,auVar8);
  auVar30 = pmaddwd(auVar8,auVar11);
  auVar22._8_4_ = 0xf5da0c5e;
  auVar22._0_8_ = 0xf5da0c5ef5da0c5e;
  auVar22._12_4_ = 0xf5da0c5e;
  auVar41 = pmaddwd(auVar56,auVar22);
  auVar22 = pmaddwd(auVar11,auVar22);
  auVar69._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar69._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar69._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar69._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar9._0_4_ = auVar30._0_4_ + 0x800 >> 0xc;
  auVar9._4_4_ = auVar30._4_4_ + 0x800 >> 0xc;
  auVar9._8_4_ = auVar30._8_4_ + 0x800 >> 0xc;
  auVar9._12_4_ = auVar30._12_4_ + 0x800 >> 0xc;
  auVar70 = packssdw(auVar69,auVar9);
  auVar60._0_4_ = auVar41._0_4_ + 0x800 >> 0xc;
  auVar60._4_4_ = auVar41._4_4_ + 0x800 >> 0xc;
  auVar60._8_4_ = auVar41._8_4_ + 0x800 >> 0xc;
  auVar60._12_4_ = auVar41._12_4_ + 0x800 >> 0xc;
  auVar12._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar61 = packssdw(auVar60,auVar12);
  local_48 = (undefined2)lVar1;
  uStack_46 = (undefined2)((ulong)lVar1 >> 0x10);
  uStack_44 = (undefined2)((ulong)lVar1 >> 0x20);
  uStack_42 = (undefined2)((ulong)lVar1 >> 0x30);
  uStack_40 = (undefined2)lVar2;
  uStack_3e = (undefined2)((ulong)lVar2 >> 0x10);
  uStack_3c = (undefined2)((ulong)lVar2 >> 0x20);
  uStack_3a = (undefined2)((ulong)lVar2 >> 0x30);
  auVar41._0_12_ = alVar68._0_12_;
  auVar41._12_2_ = alVar68[0]._6_2_;
  auVar41._14_2_ = uStack_42;
  auVar89._12_4_ = auVar41._12_4_;
  auVar89._0_10_ = alVar68._0_10_;
  auVar89._10_2_ = uStack_44;
  auVar80._10_6_ = auVar89._10_6_;
  auVar80._0_8_ = alVar68[0];
  auVar80._8_2_ = alVar68[0]._4_2_;
  auVar30._8_8_ = auVar80._8_8_;
  auVar30._6_2_ = uStack_46;
  auVar30._4_2_ = alVar68[0]._2_2_;
  auVar30._0_2_ = (undefined2)alVar68[0];
  auVar30._2_2_ = local_48;
  auVar88._2_2_ = uStack_40;
  auVar88._0_2_ = (short)alVar68[1];
  auVar88._4_2_ = alVar68[1]._2_2_;
  auVar88._6_2_ = uStack_3e;
  auVar88._8_2_ = alVar68[1]._4_2_;
  auVar88._10_2_ = uStack_3c;
  auVar88._12_2_ = alVar68[1]._6_2_;
  auVar88._14_2_ = uStack_3a;
  auVar13._8_4_ = 0xf5004a5;
  auVar13._0_8_ = 0xf5004a50f5004a5;
  auVar13._12_4_ = 0xf5004a5;
  auVar41 = pmaddwd(auVar30,auVar13);
  auVar80 = pmaddwd(auVar13,auVar88);
  auVar77._8_4_ = 0xfb5b0f50;
  auVar77._0_8_ = 0xfb5b0f50fb5b0f50;
  auVar77._12_4_ = 0xfb5b0f50;
  auVar22 = pmaddwd(auVar30,auVar77);
  auVar89 = pmaddwd(auVar88,auVar77);
  auVar82._0_4_ = auVar41._0_4_ + 0x800 >> 0xc;
  auVar82._4_4_ = auVar41._4_4_ + 0x800 >> 0xc;
  auVar82._8_4_ = auVar41._8_4_ + 0x800 >> 0xc;
  auVar82._12_4_ = auVar41._12_4_ + 0x800 >> 0xc;
  auVar14._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar14._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar14._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar14._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar30 = packssdw(auVar82,auVar14);
  auVar44._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar44._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar44._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar44._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar90._0_4_ = auVar89._0_4_ + 0x800 >> 0xc;
  auVar90._4_4_ = auVar89._4_4_ + 0x800 >> 0xc;
  auVar90._8_4_ = auVar89._8_4_ + 0x800 >> 0xc;
  auVar90._12_4_ = auVar89._12_4_ + 0x800 >> 0xc;
  auVar22 = packssdw(auVar44,auVar90);
  auVar41 = paddsw(auVar24,auVar70);
  auVar80 = psubsw(auVar24,auVar70);
  auVar82 = paddsw(auVar43,auVar61);
  auVar44 = psubsw(auVar43,auVar61);
  auVar43 = paddsw(auVar33,auVar30);
  auVar89 = psubsw(auVar33,auVar30);
  auVar91 = paddsw(auVar53,auVar22);
  auVar33 = psubsw(auVar53,auVar22);
  auVar65._0_12_ = auVar80._0_12_;
  auVar65._12_2_ = auVar80._6_2_;
  auVar65._14_2_ = auVar44._6_2_;
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._0_10_ = auVar80._0_10_;
  auVar64._10_2_ = auVar44._4_2_;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._0_8_ = auVar80._0_8_;
  auVar63._8_2_ = auVar80._4_2_;
  auVar62._8_8_ = auVar63._8_8_;
  auVar62._6_2_ = auVar44._2_2_;
  auVar62._4_2_ = auVar80._2_2_;
  auVar62._0_2_ = auVar80._0_2_;
  auVar62._2_2_ = auVar44._0_2_;
  auVar25._2_2_ = auVar44._8_2_;
  auVar25._0_2_ = auVar80._8_2_;
  auVar25._4_2_ = auVar80._10_2_;
  auVar25._6_2_ = auVar44._10_2_;
  auVar25._8_2_ = auVar80._12_2_;
  auVar25._10_2_ = auVar44._12_2_;
  auVar25._12_2_ = auVar80._14_2_;
  auVar25._14_2_ = auVar44._14_2_;
  auVar45._8_4_ = 0xf138061f;
  auVar45._0_8_ = 0xf138061ff138061f;
  auVar45._12_4_ = 0xf138061f;
  auVar44 = pmaddwd(auVar62,auVar45);
  auVar80 = pmaddwd(auVar25,auVar45);
  auVar46._8_4_ = 0x61f0ec8;
  auVar46._0_8_ = 0x61f0ec8061f0ec8;
  auVar46._12_4_ = 0x61f0ec8;
  auVar22 = pmaddwd(auVar62,auVar46);
  auVar30 = pmaddwd(auVar25,auVar46);
  auVar24._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar24._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar24._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar24._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar61._0_4_ = auVar30._0_4_ + 0x800 >> 0xc;
  auVar61._4_4_ = auVar30._4_4_ + 0x800 >> 0xc;
  auVar61._8_4_ = auVar30._8_4_ + 0x800 >> 0xc;
  auVar61._12_4_ = auVar30._12_4_ + 0x800 >> 0xc;
  auVar22 = packssdw(auVar24,auVar61);
  auVar66._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar66._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar66._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar66._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar26._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar26._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar26._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar26._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar24 = packssdw(auVar66,auVar26);
  auVar70._0_12_ = auVar89._0_12_;
  auVar70._12_2_ = auVar89._6_2_;
  auVar70._14_2_ = auVar33._6_2_;
  auVar5._12_4_ = auVar70._12_4_;
  auVar5._0_10_ = auVar89._0_10_;
  auVar5._10_2_ = auVar33._4_2_;
  auVar4._10_6_ = auVar5._10_6_;
  auVar4._0_8_ = auVar89._0_8_;
  auVar4._8_2_ = auVar89._4_2_;
  auVar3._8_8_ = auVar4._8_8_;
  auVar3._6_2_ = auVar33._2_2_;
  auVar3._4_2_ = auVar89._2_2_;
  auVar3._0_2_ = auVar89._0_2_;
  auVar3._2_2_ = auVar33._0_2_;
  auVar34._2_2_ = auVar33._8_2_;
  auVar34._0_2_ = auVar89._8_2_;
  auVar34._4_2_ = auVar89._10_2_;
  auVar34._6_2_ = auVar33._10_2_;
  auVar34._8_2_ = auVar89._12_2_;
  auVar34._10_2_ = auVar33._12_2_;
  auVar34._12_2_ = auVar89._14_2_;
  auVar34._14_2_ = auVar33._14_2_;
  auVar27._8_4_ = 0xec8f9e1;
  auVar27._0_8_ = 0xec8f9e10ec8f9e1;
  auVar27._12_4_ = 0xec8f9e1;
  auVar44 = pmaddwd(auVar3,auVar27);
  auVar80 = pmaddwd(auVar27,auVar34);
  auVar30 = pmaddwd(auVar3,auVar46);
  auVar89 = pmaddwd(auVar34,auVar46);
  auVar87._0_4_ = auVar44._0_4_ + 0x800 >> 0xc;
  auVar87._4_4_ = auVar44._4_4_ + 0x800 >> 0xc;
  auVar87._8_4_ = auVar44._8_4_ + 0x800 >> 0xc;
  auVar87._12_4_ = auVar44._12_4_ + 0x800 >> 0xc;
  auVar28._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar28._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar28._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar28._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar33 = packssdw(auVar87,auVar28);
  auVar6._0_4_ = auVar30._0_4_ + 0x800 >> 0xc;
  auVar6._4_4_ = auVar30._4_4_ + 0x800 >> 0xc;
  auVar6._8_4_ = auVar30._8_4_ + 0x800 >> 0xc;
  auVar6._12_4_ = auVar30._12_4_ + 0x800 >> 0xc;
  auVar35._0_4_ = auVar89._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar89._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar89._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar89._12_4_ + 0x800 >> 0xc;
  auVar30 = packssdw(auVar6,auVar35);
  alVar47 = (__m128i)paddsw(auVar41,auVar43);
  auVar41 = psubsw(auVar41,auVar43);
  auVar89 = paddsw(auVar82,auVar91);
  auVar80 = psubsw(auVar82,auVar91);
  auVar44 = paddsw(auVar22,auVar33);
  auVar22 = psubsw(auVar22,auVar33);
  alVar36 = (__m128i)paddsw(auVar24,auVar30);
  auVar24 = psubsw(auVar24,auVar30);
  auVar74._0_12_ = auVar41._0_12_;
  auVar74._12_2_ = auVar41._6_2_;
  auVar74._14_2_ = auVar80._6_2_;
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._0_10_ = auVar41._0_10_;
  auVar73._10_2_ = auVar80._4_2_;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._0_8_ = auVar41._0_8_;
  auVar72._8_2_ = auVar41._4_2_;
  auVar71._8_8_ = auVar72._8_8_;
  auVar71._6_2_ = auVar80._2_2_;
  auVar71._4_2_ = auVar41._2_2_;
  auVar71._0_2_ = auVar41._0_2_;
  auVar71._2_2_ = auVar80._0_2_;
  auVar15._2_2_ = auVar80._8_2_;
  auVar15._0_2_ = auVar41._8_2_;
  auVar15._4_2_ = auVar41._10_2_;
  auVar15._6_2_ = auVar80._10_2_;
  auVar15._8_2_ = auVar41._12_2_;
  auVar15._10_2_ = auVar80._12_2_;
  auVar15._12_2_ = auVar41._14_2_;
  auVar15._14_2_ = auVar80._14_2_;
  auVar83._8_4_ = 0xb500b50;
  auVar83._0_8_ = 0xb500b500b500b50;
  auVar83._12_4_ = 0xb500b50;
  auVar41 = pmaddwd(auVar71,auVar83);
  auVar30 = pmaddwd(auVar15,auVar83);
  auVar78._8_4_ = 0xf4b00b50;
  auVar78._0_8_ = 0xf4b00b50f4b00b50;
  auVar78._12_4_ = 0xf4b00b50;
  auVar33 = pmaddwd(auVar71,auVar78);
  auVar80 = pmaddwd(auVar15,auVar78);
  auVar10._0_4_ = auVar41._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar41._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar41._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar41._12_4_ + 0x800 >> 0xc;
  auVar91._0_4_ = auVar30._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar30._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar30._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar30._12_4_ + 0x800 >> 0xc;
  auVar30 = packssdw(auVar10,auVar91);
  auVar75._0_4_ = auVar33._0_4_ + 0x800 >> 0xc;
  auVar75._4_4_ = auVar33._4_4_ + 0x800 >> 0xc;
  auVar75._8_4_ = auVar33._8_4_ + 0x800 >> 0xc;
  auVar75._12_4_ = auVar33._12_4_ + 0x800 >> 0xc;
  auVar16._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  alVar76 = (__m128i)packssdw(auVar75,auVar16);
  auVar20._0_12_ = auVar22._0_12_;
  auVar20._12_2_ = auVar22._6_2_;
  auVar20._14_2_ = auVar24._6_2_;
  auVar19._12_4_ = auVar20._12_4_;
  auVar19._0_10_ = auVar22._0_10_;
  auVar19._10_2_ = auVar24._4_2_;
  auVar18._10_6_ = auVar19._10_6_;
  auVar18._0_8_ = auVar22._0_8_;
  auVar18._8_2_ = auVar22._4_2_;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._6_2_ = auVar24._2_2_;
  auVar17._4_2_ = auVar22._2_2_;
  auVar17._0_2_ = auVar22._0_2_;
  auVar17._2_2_ = auVar24._0_2_;
  auVar33._2_2_ = auVar24._8_2_;
  auVar33._0_2_ = auVar22._8_2_;
  auVar33._4_2_ = auVar22._10_2_;
  auVar33._6_2_ = auVar24._10_2_;
  auVar33._8_2_ = auVar22._12_2_;
  auVar33._10_2_ = auVar24._12_2_;
  auVar33._12_2_ = auVar22._14_2_;
  auVar33._14_2_ = auVar24._14_2_;
  auVar80 = pmaddwd(auVar17,auVar83);
  auVar24 = pmaddwd(auVar83,auVar33);
  auVar41 = pmaddwd(auVar17,auVar78);
  auVar22 = pmaddwd(auVar33,auVar78);
  auVar67._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar67._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar67._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar67._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar84._0_4_ = auVar24._0_4_ + 0x800 >> 0xc;
  auVar84._4_4_ = auVar24._4_4_ + 0x800 >> 0xc;
  auVar84._8_4_ = auVar24._8_4_ + 0x800 >> 0xc;
  auVar84._12_4_ = auVar24._12_4_ + 0x800 >> 0xc;
  alVar68 = (__m128i)packssdw(auVar67,auVar84);
  auVar21._0_4_ = auVar41._0_4_ + 0x800 >> 0xc;
  auVar21._4_4_ = auVar41._4_4_ + 0x800 >> 0xc;
  auVar21._8_4_ = auVar41._8_4_ + 0x800 >> 0xc;
  auVar21._12_4_ = auVar41._12_4_ + 0x800 >> 0xc;
  auVar43._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar43._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar43._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar43._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar22 = packssdw(auVar21,auVar43);
  *output = alVar47;
  alVar47 = (__m128i)psubsw((undefined1  [16])0x0,auVar44);
  output[1] = alVar47;
  output[2] = alVar68;
  alVar47 = (__m128i)psubsw((undefined1  [16])0x0,auVar30);
  output[3] = alVar47;
  output[4] = alVar76;
  alVar47 = (__m128i)psubsw((undefined1  [16])0x0,auVar22);
  output[5] = alVar47;
  output[6] = alVar36;
  alVar47 = (__m128i)psubsw((undefined1  [16])0x0,auVar89);
  output[7] = alVar47;
  return;
}

Assistant:

void av1_iadst8_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);

  // stage 1
  __m128i x[8];
  x[0] = input[7];
  x[1] = input[0];
  x[2] = input[5];
  x[3] = input[2];
  x[4] = input[3];
  x[5] = input[4];
  x[6] = input[1];
  x[7] = input[6];

  // stage 2
  btf_16_sse2(cospi_p04_p60, cospi_p60_m04, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p20_p44, cospi_p44_m20, x[2], x[3], x[2], x[3]);
  btf_16_sse2(cospi_p36_p28, cospi_p28_m36, x[4], x[5], x[4], x[5]);
  btf_16_sse2(cospi_p52_p12, cospi_p12_m52, x[6], x[7], x[6], x[7]);

  // stage 3
  btf_16_adds_subs_sse2(x[0], x[4]);
  btf_16_adds_subs_sse2(x[1], x[5]);
  btf_16_adds_subs_sse2(x[2], x[6]);
  btf_16_adds_subs_sse2(x[3], x[7]);

  // stage 4
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);
  btf_16_sse2(cospi_m48_p16, cospi_p16_p48, x[6], x[7], x[6], x[7]);

  // stage 5
  btf_16_adds_subs_sse2(x[0], x[2]);
  btf_16_adds_subs_sse2(x[1], x[3]);
  btf_16_adds_subs_sse2(x[4], x[6]);
  btf_16_adds_subs_sse2(x[5], x[7]);

  // stage 6
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[2], x[3], x[2], x[3]);
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[6], x[7], x[6], x[7]);

  // stage 7
  output[0] = x[0];
  output[1] = _mm_subs_epi16(__zero, x[4]);
  output[2] = x[6];
  output[3] = _mm_subs_epi16(__zero, x[2]);
  output[4] = x[3];
  output[5] = _mm_subs_epi16(__zero, x[7]);
  output[6] = x[5];
  output[7] = _mm_subs_epi16(__zero, x[1]);
}